

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

IfStatement * __thiscall
soul::PoolAllocator::
allocate<soul::AST::IfStatement,soul::AST::Context&,bool&,soul::AST::Expression&,soul::AST::Block&,soul::pool_ptr<soul::AST::Statement>&>
          (PoolAllocator *this,Context *args,bool *args_1,Expression *args_2,Block *args_3,
          pool_ptr<soul::AST::Statement> *args_4)

{
  PoolItem *pPVar1;
  pool_ptr<soul::AST::Statement> local_38;
  
  pPVar1 = allocateSpaceForObject(this,0x48);
  local_38 = (pool_ptr<soul::AST::Statement>)args_4->object;
  AST::IfStatement::IfStatement
            ((IfStatement *)&pPVar1->item,args,*args_1,args_2,&args_3->super_Statement,&local_38);
  pPVar1->destructor =
       allocate<soul::AST::IfStatement,_soul::AST::Context_&,_bool_&,_soul::AST::Expression_&,_soul::AST::Block_&,_soul::pool_ptr<soul::AST::Statement>_&>
       ::anon_class_1_0_00000001::__invoke;
  return (IfStatement *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }